

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

void __thiscall Grid::Grid(Grid *this,s_i raw,int sep,int just,int fill,bool *empty)

{
  cg_box *this_00;
  cg_other *this_01;
  bool *empty_local;
  int fill_local;
  int just_local;
  int sep_local;
  Grid *this_local;
  
  this->SLIMEBIT_SHIFT = 0x1e;
  this->SLIMEBIT = 1 << ((byte)this->SLIMEBIT_SHIFT & 0x1f);
  this_00 = (cg_box *)operator_new(0x10);
  cg_box::cg_box(this_00,raw,sep,just,fill,empty);
  refc<cg_box>::refc(&this->box,this_00);
  this_01 = (cg_other *)operator_new(0x18);
  cg_other::cg_other(this_01);
  refc<cg_other>::refc(&this->other,this_01);
  return;
}

Assistant:

Grid::Grid(s_i raw, int sep, int just, int fill, bool &empty):
        box(new cg_box(raw,sep,just,fill,empty)),
        other(new cg_other) { }